

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedReader.cpp
# Opt level: O0

bool ZXing::OneD::IsCharacterPair(PatternView *v)

{
  bool bVar1;
  int iVar2;
  PatternView *in_RDI;
  float modSizeRef;
  float in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  uint modules;
  PatternView *in_stack_ffffffffffffffb0;
  PatternView *in_stack_ffffffffffffffc0;
  
  DataBar::ModSizeFinder(in_stack_ffffffffffffffc0);
  DataBar::LeftChar(in_stack_ffffffffffffffb0);
  bVar1 = DataBar::IsCharacter
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  in_stack_ffffffffffffffac = in_stack_ffffffffffffffac & 0xffffff;
  if (bVar1) {
    iVar2 = PatternView::size(in_RDI);
    modules = CONCAT13((char)(in_stack_ffffffffffffffac >> 0x18),
                       CONCAT12(1,(short)in_stack_ffffffffffffffac));
    if (iVar2 != 0xf) {
      DataBar::RightChar(in_stack_ffffffffffffffb0);
      bVar1 = DataBar::IsCharacter(in_stack_ffffffffffffffb0,modules,in_stack_ffffffffffffffa8);
      modules = (uint)bVar1 << 0x10;
    }
    in_stack_ffffffffffffffac = (modules >> 0x10) << 0x18;
  }
  return SUB41(in_stack_ffffffffffffffac >> 0x18,0);
}

Assistant:

static bool IsCharacterPair(const PatternView& v)
{
	float modSizeRef = ModSizeFinder(v);
	return IsCharacter(LeftChar(v), 17, modSizeRef) &&
		   (v.size() == HALF_PAIR_SIZE || IsCharacter(RightChar(v), 17, modSizeRef));
}